

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testIsComplete.cpp
# Opt level: O3

void testIsComplete(string *tempDir)

{
  pointer pcVar1;
  _Alloc_hider _Var2;
  _Alloc_hider _Var3;
  _Alloc_hider _Var4;
  _Alloc_hider _Var5;
  bool bVar6;
  ushort uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  Rgba *base;
  int y;
  long lVar11;
  int x;
  long lVar12;
  uint uVar13;
  float i;
  float i_00;
  RgbaOutputFile out;
  uif x_1;
  string ict;
  string ct;
  string icsl;
  string csl;
  Rgba *local_80;
  V2f local_50;
  V2f local_48;
  V2f local_40;
  V2f local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing isComplete() function",0x1d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  csl._M_dataplus._M_p = (pointer)&csl.field_2;
  pcVar1 = (tempDir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&csl,pcVar1,pcVar1 + tempDir->_M_string_length);
  std::__cxx11::string::append((char *)&csl);
  icsl._M_dataplus._M_p = (pointer)&icsl.field_2;
  pcVar1 = (tempDir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&icsl,pcVar1,pcVar1 + tempDir->_M_string_length);
  std::__cxx11::string::append((char *)&icsl);
  ct._M_dataplus._M_p = (pointer)&ct.field_2;
  pcVar1 = (tempDir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)&ct,pcVar1,pcVar1 + tempDir->_M_string_length)
  ;
  std::__cxx11::string::append((char *)&ct);
  ict._M_dataplus._M_p = (pointer)&ict.field_2;
  pcVar1 = (tempDir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&ict,pcVar1,pcVar1 + tempDir->_M_string_length);
  std::__cxx11::string::append((char *)&ict);
  _Var5 = csl._M_dataplus;
  _Var4 = icsl._M_dataplus;
  _Var3 = ct._M_dataplus;
  _Var2 = ict._M_dataplus;
  base = (Rgba *)operator_new__(0xb8938);
  lVar11 = 0;
  local_80 = base;
  do {
    i = (float)(int)lVar11;
    lVar12 = 0;
    do {
      i_00 = (float)(int)lVar12;
      if (lVar12 == 0) {
        uVar8 = (uint)i_00 >> 0x10;
      }
      else if (half::_eLut[(uint)i_00 >> 0x17] == 0) {
        uVar7 = half::convert((int)i_00);
        uVar8 = (uint)uVar7;
      }
      else {
        uVar8 = (uint)half::_eLut[(uint)i_00 >> 0x17] +
                (((uint)i_00 & 0x7fffff) + 0xfff + (uint)(((uint)i_00 >> 0xd & 1) != 0) >> 0xd);
      }
      uVar13 = (uint)i >> 0x10;
      if (lVar11 != 0) {
        if (half::_eLut[(uint)i >> 0x17] == 0) {
          uVar7 = half::convert((int)i);
          uVar13 = (uint)uVar7;
        }
        else {
          uVar13 = (uint)half::_eLut[(uint)i >> 0x17] +
                   (((uint)i & 0x7fffff) + 0xfff + (uint)(((uint)i >> 0xd & 1) != 0) >> 0xd);
        }
      }
      local_80[lVar12] =
           (Rgba)((ulong)(uVar8 & 0xffff) | (ulong)(uVar13 << 0x10) | 0x3c00000000000000);
      lVar12 = lVar12 + 1;
    } while (lVar12 != 0x147);
    lVar11 = lVar11 + 1;
    local_80 = local_80 + 0x147;
  } while (lVar11 != 0x121);
  local_38.x = 0.0;
  local_38.y = 0.0;
  iVar9 = Imf_2_5::globalThreadCount();
  Imf_2_5::RgbaOutputFile::RgbaOutputFile
            (&out,_Var5._M_p,0x147,0x121,WRITE_RGBA,1.0,&local_38,1.0,INCREASING_Y,PIZ_COMPRESSION,
             iVar9);
  Imf_2_5::RgbaOutputFile::setFrameBuffer(&out,base,1,0x147);
  Imf_2_5::RgbaOutputFile::writePixels(&out,0x121);
  Imf_2_5::RgbaOutputFile::~RgbaOutputFile(&out);
  local_40.x = 0.0;
  local_40.y = 0.0;
  iVar9 = Imf_2_5::globalThreadCount();
  Imf_2_5::RgbaOutputFile::RgbaOutputFile
            (&out,_Var4._M_p,0x147,0x121,WRITE_RGBA,1.0,&local_40,1.0,INCREASING_Y,PIZ_COMPRESSION,
             iVar9);
  Imf_2_5::RgbaOutputFile::setFrameBuffer(&out,base,1,0x147);
  Imf_2_5::RgbaOutputFile::writePixels(&out,0x120);
  Imf_2_5::RgbaOutputFile::~RgbaOutputFile(&out);
  local_48.x = 0.0;
  local_48.y = 0.0;
  iVar9 = Imf_2_5::globalThreadCount();
  Imf_2_5::TiledRgbaOutputFile::TiledRgbaOutputFile
            ((TiledRgbaOutputFile *)&out,_Var3._M_p,0x147,0x121,0x11,0x11,ONE_LEVEL,ROUND_DOWN,
             WRITE_RGBA,1.0,&local_48,1.0,INCREASING_Y,ZIP_COMPRESSION,iVar9);
  Imf_2_5::TiledRgbaOutputFile::setFrameBuffer((TiledRgbaOutputFile *)&out,base,1,0x147);
  iVar9 = Imf_2_5::TiledRgbaOutputFile::numXTiles((TiledRgbaOutputFile *)&out,0);
  iVar10 = Imf_2_5::TiledRgbaOutputFile::numYTiles((TiledRgbaOutputFile *)&out,0);
  Imf_2_5::TiledRgbaOutputFile::writeTiles((TiledRgbaOutputFile *)&out,0,iVar9 + -1,0,iVar10 + -1,0)
  ;
  Imf_2_5::TiledRgbaOutputFile::~TiledRgbaOutputFile((TiledRgbaOutputFile *)&out);
  local_50.x = 0.0;
  local_50.y = 0.0;
  iVar9 = Imf_2_5::globalThreadCount();
  Imf_2_5::TiledRgbaOutputFile::TiledRgbaOutputFile
            ((TiledRgbaOutputFile *)&out,_Var2._M_p,0x147,0x121,0x11,0x11,ONE_LEVEL,ROUND_DOWN,
             WRITE_RGBA,1.0,&local_50,1.0,INCREASING_Y,ZIP_COMPRESSION,iVar9);
  Imf_2_5::TiledRgbaOutputFile::setFrameBuffer((TiledRgbaOutputFile *)&out,base,1,0x147);
  iVar9 = Imf_2_5::TiledRgbaOutputFile::numXTiles((TiledRgbaOutputFile *)&out,0);
  iVar10 = Imf_2_5::TiledRgbaOutputFile::numYTiles((TiledRgbaOutputFile *)&out,0);
  Imf_2_5::TiledRgbaOutputFile::writeTiles((TiledRgbaOutputFile *)&out,0,iVar9 + -1,0,iVar10 + -2,0)
  ;
  Imf_2_5::TiledRgbaOutputFile::~TiledRgbaOutputFile((TiledRgbaOutputFile *)&out);
  operator_delete__(base);
  _Var5 = csl._M_dataplus;
  _Var4 = icsl._M_dataplus;
  _Var3 = ct._M_dataplus;
  _Var2 = ict._M_dataplus;
  iVar9 = Imf_2_5::globalThreadCount();
  Imf_2_5::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&out,_Var5._M_p,iVar9);
  bVar6 = Imf_2_5::RgbaInputFile::isComplete((RgbaInputFile *)&out);
  if (!bVar6) {
    __assert_fail("in.isComplete()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testIsComplete.cpp"
                  ,0x6e,
                  "void (anonymous namespace)::checkFiles(const char *, const char *, const char *, const char *)"
                 );
  }
  Imf_2_5::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&out);
  iVar9 = Imf_2_5::globalThreadCount();
  Imf_2_5::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&out,_Var4._M_p,iVar9);
  bVar6 = Imf_2_5::RgbaInputFile::isComplete((RgbaInputFile *)&out);
  if (bVar6) {
    __assert_fail("!in.isComplete()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testIsComplete.cpp"
                  ,0x73,
                  "void (anonymous namespace)::checkFiles(const char *, const char *, const char *, const char *)"
                 );
  }
  Imf_2_5::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&out);
  iVar9 = Imf_2_5::globalThreadCount();
  Imf_2_5::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&out,_Var3._M_p,iVar9);
  bVar6 = Imf_2_5::RgbaInputFile::isComplete((RgbaInputFile *)&out);
  if (!bVar6) {
    __assert_fail("in.isComplete()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testIsComplete.cpp"
                  ,0x78,
                  "void (anonymous namespace)::checkFiles(const char *, const char *, const char *, const char *)"
                 );
  }
  Imf_2_5::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&out);
  iVar9 = Imf_2_5::globalThreadCount();
  Imf_2_5::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&out,_Var2._M_p,iVar9);
  bVar6 = Imf_2_5::RgbaInputFile::isComplete((RgbaInputFile *)&out);
  if (bVar6) {
    __assert_fail("!in.isComplete()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testIsComplete.cpp"
                  ,0x7d,
                  "void (anonymous namespace)::checkFiles(const char *, const char *, const char *, const char *)"
                 );
  }
  Imf_2_5::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&out);
  iVar9 = Imf_2_5::globalThreadCount();
  Imf_2_5::TiledRgbaInputFile::TiledRgbaInputFile((TiledRgbaInputFile *)&out,_Var3._M_p,iVar9);
  bVar6 = Imf_2_5::TiledRgbaInputFile::isComplete((TiledRgbaInputFile *)&out);
  if (!bVar6) {
    __assert_fail("in.isComplete()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testIsComplete.cpp"
                  ,0x82,
                  "void (anonymous namespace)::checkFiles(const char *, const char *, const char *, const char *)"
                 );
  }
  Imf_2_5::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&out);
  iVar9 = Imf_2_5::globalThreadCount();
  Imf_2_5::TiledRgbaInputFile::TiledRgbaInputFile((TiledRgbaInputFile *)&out,_Var2._M_p,iVar9);
  bVar6 = Imf_2_5::TiledRgbaInputFile::isComplete((TiledRgbaInputFile *)&out);
  if (bVar6) {
    __assert_fail("!in.isComplete()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testIsComplete.cpp"
                  ,0x87,
                  "void (anonymous namespace)::checkFiles(const char *, const char *, const char *, const char *)"
                 );
  }
  Imf_2_5::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&out);
  remove(csl._M_dataplus._M_p);
  remove(icsl._M_dataplus._M_p);
  remove(ct._M_dataplus._M_p);
  remove(ict._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ok\n",3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ict._M_dataplus._M_p != &ict.field_2) {
    operator_delete(ict._M_dataplus._M_p,ict.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ct._M_dataplus._M_p != &ct.field_2) {
    operator_delete(ct._M_dataplus._M_p,ct.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)icsl._M_dataplus._M_p != &icsl.field_2) {
    operator_delete(icsl._M_dataplus._M_p,icsl.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)csl._M_dataplus._M_p != &csl.field_2) {
    operator_delete(csl._M_dataplus._M_p,csl.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void
testIsComplete (const std::string &tempDir)
{
    try
    {
	cout << "Testing isComplete() function" << endl;

	std::string csl = tempDir + "imf_test_complete_sl.exr";
	std::string icsl = tempDir + "imf_test_incomplete_sl.exr";
	std::string ct = tempDir + "imf_test_complete_t.exr";
	std::string ict = tempDir + "imf_test_incomplete_t.exr";

	writeFiles (csl.c_str(), icsl.c_str(), ct.c_str(), ict.c_str(), 327, 289, 17, 17);
	checkFiles (csl.c_str(), icsl.c_str(), ct.c_str(), ict.c_str());

	remove (csl.c_str());
	remove (icsl.c_str());
	remove (ct.c_str());
	remove (ict.c_str());

	cout << "ok\n" << endl;
    }
    catch (const std::exception &e)
    {
	cerr << "ERROR -- caught exception: " << e.what() << endl;
	assert (false);
    }
}